

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LlvmModule * CompileLlvm(ExpressionContext *exprCtx,ExprModule *expression)

{
  TypeBase **ppTVar1;
  FunctionData *pFVar2;
  VariableData *pVVar3;
  char *__src;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ScopeData *pSVar7;
  undefined4 extraout_var;
  LlvmModule *pLVar8;
  undefined4 extraout_var_01;
  ulong uVar9;
  ExprBase *pEVar10;
  uint uVar11;
  ulong uVar12;
  ArrayView<TypeBase_*> argumentTypes;
  ArrayView<TypeBase_*> argumentTypes_00;
  ArrayView<TypeBase_*> argumentTypes_01;
  ArrayView<TypeBase_*> argumentTypes_02;
  ArrayView<TypeBase_*> argumentTypes_03;
  ArrayView<TypeBase_*> argumentTypes_04;
  ArrayView<TypeBase_*> argumentTypes_05;
  ArrayView<TypeBase_*> argumentTypes_06;
  TypeBase *arguments [2];
  TraceScope traceScope;
  TypeStruct *local_13a8;
  TypeStruct *local_13a0;
  TypeBase *local_1398;
  TraceScope local_1390;
  LlvmCompilationContext local_1380;
  undefined4 extraout_var_00;
  
  if (CompileLlvm(ExpressionContext&,ExprModule*)::token == '\0') {
    iVar5 = __cxa_guard_acquire(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    if (iVar5 != 0) {
      CompileLlvm::token = NULLC::TraceGetToken("InstructionTreeLlvm","CompileLlvm");
      __cxa_guard_release(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_1390,CompileLlvm::token);
  LlvmCompilationContext::LlvmCompilationContext(&local_1380,exprCtx);
  local_1380.builder = (LLVMBuilderRef)0x0;
  local_1380.functionPassManager = (LLVMPassManagerRef)0x0;
  local_1380.context = (LLVMContextRef)0x0;
  local_1380.module = (LLVMModuleRef)0x0;
  local_1380.types.count = ((local_1380.ctx)->types).count;
  uVar12 = (ulong)local_1380.types.count;
  if (uVar12 != 0) {
    ppTVar1 = ((local_1380.ctx)->types).data;
    uVar9 = 0;
    do {
      ppTVar1[uVar9]->typeIndex = (uint)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  if (local_1380.types.max <= local_1380.types.count) {
    SmallArray<LLVMTypeRefOpaque_*,_128U>::grow(&local_1380.types,local_1380.types.count);
  }
  memset(local_1380.types.data,0,uVar12 << 3);
  local_1380.functions.count = ((local_1380.ctx)->functions).count;
  if (local_1380.functions.max <= local_1380.functions.count) {
    SmallArray<LLVMValueRefOpaque_*,_128U>::grow(&local_1380.functions,local_1380.functions.count);
  }
  memset(local_1380.functions.data,0,(ulong)local_1380.functions.count * 8);
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,(ArrayView<TypeBase_*>)ZEXT816(0));
  local_13a8 = (local_1380.ctx)->typeAutoRef;
  local_13a0 = (TypeStruct *)(local_1380.ctx)->typeTypeID;
  argumentTypes._8_8_ = 2;
  argumentTypes.data = (TypeBase **)&local_13a8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeNullPtr,argumentTypes);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  argumentTypes_00._8_8_ = 2;
  argumentTypes_00.data = (TypeBase **)&local_13a8;
  local_13a0 = local_13a8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13a8,argumentTypes_00);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeLong;
  argumentTypes_01._8_8_ = 2;
  argumentTypes_01.data = (TypeBase **)&local_13a8;
  local_13a0 = local_13a8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13a8,argumentTypes_01);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeDouble;
  argumentTypes_02._8_8_ = 2;
  argumentTypes_02.data = (TypeBase **)&local_13a8;
  local_13a0 = local_13a8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13a8,argumentTypes_02);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  argumentTypes_03._8_8_ = 1;
  argumentTypes_03.data = (TypeBase **)&local_13a8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_03);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeLong;
  argumentTypes_04._8_8_ = 1;
  argumentTypes_04.data = (TypeBase **)&local_13a8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_04);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeDouble;
  argumentTypes_05._8_8_ = 1;
  argumentTypes_05.data = (TypeBase **)&local_13a8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_05);
  local_13a8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  local_13a0 = (TypeStruct *)(local_1380.ctx)->typeNullPtr;
  argumentTypes_06._8_8_ = 3;
  argumentTypes_06.data = (TypeBase **)&local_13a8;
  local_1398 = (TypeBase *)local_13a0;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_06);
  if (((local_1380.ctx)->functions).count != 0) {
    uVar12 = 0;
    do {
      pFVar2 = ((local_1380.ctx)->functions).data[uVar12];
      bVar4 = ExpressionContext::IsGenericFunction(local_1380.ctx,pFVar2);
      if ((!bVar4) &&
         ((pFVar2->isPrototype != true || (pFVar2->implementation == (FunctionData *)0x0)))) {
        if (local_1380.functions.count <= pFVar2->functionIndex) goto LAB_001825e8;
        if (local_1380.functions.data[pFVar2->functionIndex] == (LLVMValueRefOpaque *)0x0) {
          CreateLlvmFunctionName(&local_1380,pFVar2);
          CompileLlvmFunctionType(&local_1380,pFVar2->type);
          if (local_1380.functions.count <= pFVar2->functionIndex) goto LAB_001825e8;
          local_1380.functions.data[pFVar2->functionIndex] = (LLVMValueRefOpaque *)&placeholderValue
          ;
          if ((pFVar2->importModule == (ModuleData *)0x0) && (pFVar2->isPrototype == true)) {
            CompileLlvmExternalFunctionWrapper(&local_1380,pFVar2);
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar6 = ((local_1380.ctx)->functions).count;
    } while (uVar12 < uVar6);
    if (uVar6 != 0) {
      uVar12 = 0;
      do {
        pFVar2 = ((local_1380.ctx)->functions).data[uVar12];
        if ((pFVar2->isPrototype == true) && (pFVar2->implementation != (FunctionData *)0x0)) {
          uVar6 = pFVar2->implementation->functionIndex;
          if ((local_1380.functions.count <= uVar6) ||
             (local_1380.functions.count <= pFVar2->functionIndex)) {
LAB_001825e8:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<LLVMValueRefOpaque *, 128>::operator[](unsigned int) [T = LLVMValueRefOpaque *, N = 128]"
                         );
          }
          local_1380.functions.data[pFVar2->functionIndex] = local_1380.functions.data[uVar6];
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < ((local_1380.ctx)->functions).count);
    }
  }
  if (((local_1380.ctx)->variables).count != 0) {
    uVar12 = 0;
    do {
      pVVar3 = ((local_1380.ctx)->variables).data[uVar12];
      pSVar7 = ExpressionContext::GlobalScopeFrom(local_1380.ctx,pVVar3->scope);
      if (pSVar7 != (ScopeData *)0x0) {
        CompileLlvmType(&local_1380,pVVar3->type);
        __src = (pVVar3->name->name).begin;
        uVar9 = (long)(pVVar3->name->name).end - (long)__src;
        iVar5 = (*(local_1380.allocator)->_vptr_Allocator[2])
                          (local_1380.allocator,(ulong)((int)uVar9 + 1));
        uVar9 = uVar9 & 0xffffffff;
        memcpy((void *)CONCAT44(extraout_var,iVar5),__src,uVar9);
        *(undefined1 *)((long)CONCAT44(extraout_var,iVar5) + uVar9) = 0;
        local_13a8 = (TypeStruct *)&placeholderValue;
        if (pVVar3->importModule == (ModuleData *)0x0) {
          CompileLlvmType(&local_1380,pVVar3->type);
        }
        if (local_1380.variables.bucketCount != 0) {
          uVar11 = pVVar3->uniqueId * -0x61c88647;
          iVar5 = 0;
          uVar6 = local_1380.variables.bucketCount;
          do {
            uVar11 = uVar11 & local_1380.variables.bucketCount - 1;
            if (local_1380.variables.data[uVar11].key == 0) break;
            if (local_1380.variables.data[uVar11].key == pVVar3->uniqueId) {
              __assert_fail("!ctx.variables.find(variable->uniqueId)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                            ,0xa25,"LlvmModule *CompileLlvm(ExpressionContext &, ExprModule *)");
            }
            uVar11 = uVar11 + iVar5 + 1;
            iVar5 = iVar5 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (&local_1380.variables,&pVVar3->uniqueId,(LLVMValueRefOpaque **)&local_13a8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((local_1380.ctx)->variables).count);
  }
  if ((expression->definitions).count != 0) {
    uVar12 = 0;
    do {
      CompileLlvm(&local_1380,(expression->definitions).data[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (expression->definitions).count);
  }
  local_1380.skipFunctionDefinitions = true;
  local_1380.currentFunction = (LLVMValueRef)&placeholderValue;
  local_1380.currentFunctionGlobal = true;
  pEVar10 = (expression->setup).head;
  if (pEVar10 != (ExprBase *)0x0) {
    do {
      CompileLlvm(&local_1380,pEVar10);
      pEVar10 = pEVar10->next;
    } while (pEVar10 != (ExprBase *)0x0);
  }
  pEVar10 = (expression->expressions).head;
  if (pEVar10 != (ExprBase *)0x0) {
    do {
      CompileLlvm(&local_1380,pEVar10);
      pEVar10 = pEVar10->next;
    } while (pEVar10 != (ExprBase *)0x0);
  }
  local_1380.currentFunction = (LLVMValueRef)0x0;
  local_1380.currentFunctionGlobal = false;
  iVar5 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0x10);
  pLVar8 = (LlvmModule *)CONCAT44(extraout_var_00,iVar5);
  pLVar8->moduleData = (char *)0x0;
  pLVar8->moduleSize = 0;
  iVar5 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0);
  pLVar8->moduleData = (char *)CONCAT44(extraout_var_01,iVar5);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::~SmallArray(&local_1380.loopInfo);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&local_1380.currentRestoreBlocks);
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
  ~SmallDenseMap(&local_1380.variables);
  SmallArray<LLVMValueRefOpaque_*,_128U>::~SmallArray(&local_1380.functions);
  SmallArray<LLVMTypeRefOpaque_*,_128U>::~SmallArray(&local_1380.types);
  NULLC::TraceScope::~TraceScope(&local_1390);
  return pLVar8;
}

Assistant:

LlvmModule* CompileLlvm(ExpressionContext &exprCtx, ExprModule *expression)
{
	TRACE_SCOPE("InstructionTreeLlvm", "CompileLlvm");

	LlvmCompilationContext ctx(exprCtx);

	ctx.context = LLVMContextCreate();

	ctx.module = LLVMModuleCreateWithNameInContext("module", ctx.context);

	ctx.builder = LLVMCreateBuilderInContext(ctx.context);

	ctx.functionPassManager = LLVMCreateFunctionPassManagerForModule(ctx.module);

	LLVMAddBasicAliasAnalysisPass(ctx.functionPassManager);

	if(ctx.enableOptimization)
	{
		LLVMAddScalarReplAggregatesPass(ctx.functionPassManager);
		LLVMAddInstructionCombiningPass(ctx.functionPassManager);
		LLVMAddEarlyCSEPass(ctx.functionPassManager);
		LLVMAddReassociatePass(ctx.functionPassManager);
		LLVMAddGVNPass(ctx.functionPassManager);
		LLVMAddConstantPropagationPass(ctx.functionPassManager);
	}

	LLVMAddCFGSimplificationPass(ctx.functionPassManager);
	LLVMAddAggressiveDCEPass(ctx.functionPassManager);

	LLVMInitializeFunctionPassManager(ctx.functionPassManager);

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
		ctx.ctx.types[i]->typeIndex = i;

	// Reserve types, generate as required
	ctx.types.resize(ctx.ctx.types.size());
	memset(ctx.types.data, 0, ctx.types.count * sizeof(ctx.types[0]));

	// Reserve functions
	ctx.functions.resize(ctx.ctx.functions.size());
	memset(ctx.functions.data, 0, ctx.functions.count * sizeof(ctx.functions[0]));

	// Create runtime support functions
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmAbortNoReturn", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, ArrayView<TypeBase*>()));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeAutoRef, ctx.ctx.typeTypeID };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmConvertPtr", CompileLlvmFunctionType(ctx, ctx.ctx.typeNullPtr, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeInt, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong, ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeLong, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble, ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeDouble, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeNullPtr, ctx.ctx.typeNullPtr };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmExternalCall", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	// Generate functions
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		// Skip prototypes that will have an implementation later
		if(function->isPrototype && function->implementation)
			continue;

		// Skip if function is already ready
		if(ctx.functions[function->functionIndex])
			continue;

		LLVMValueRef llvmFunction = LLVMAddFunction(ctx.module, CreateLlvmFunctionName(ctx, function), CompileLlvmFunctionType(ctx, function->type));

		if(IsStructReturnType(function->type->returnType))
		{
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("nonnull", unsigned(strlen("nonnull"))), 0));
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));
		}

		ctx.functions[function->functionIndex] = llvmFunction;

		// Create an external function call wrapper
		if(function->importModule == NULL && function->isPrototype)
			CompileLlvmExternalFunctionWrapper(ctx, function);
	}

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(function->isPrototype && function->implementation)
			ctx.functions[function->functionIndex] = ctx.functions[function->implementation->functionIndex];
	}

	// Generate global variables
	for(unsigned i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			LLVMValueRef value = LLVMAddGlobal(ctx.module, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			if(!variable->importModule)
				LLVMSetInitializer(value, LLVMConstNull(CompileLlvmType(ctx, variable->type)));

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, value);
		}
	}

	for(unsigned i = 0; i < expression->definitions.size(); i++)
		CompileLlvm(ctx, expression->definitions[i]);

	ctx.skipFunctionDefinitions = true;

	// Generate global function
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmEntry", LLVMFunctionType(LLVMVoidTypeInContext(ctx.context), NULL, 0, false));

		LLVMSetLinkage(function, LLVMExternalLinkage);

		// Setup global function
		ctx.currentFunction = function;
		ctx.currentFunctionGlobal = true;

		LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMPositionBuilderAtEnd(ctx.builder, block);

		for(ExprBase *value = expression->setup.head; value; value = value->next)
			CompileLlvm(ctx, value);

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
			CompileLlvm(ctx, value);

		LLVMBuildRetVoid(ctx.builder);

		CheckFunction(ctx, ctx.currentFunction, InplaceStr("global"));

		if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
			LLVMRunFunctionPassManager(ctx.functionPassManager, function);

		ctx.currentFunction = NULL;
		ctx.currentFunctionGlobal = false;
	}

	LLVMFinalizeFunctionPassManager(ctx.functionPassManager);

	char *error = NULL;

	if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
	{
		printf("LLVM module verification failed with:\n%s\n", error);

		LLVMDisposeMessage(error);

		LLVMDisposePassManager(ctx.functionPassManager);

		LLVMDisposeBuilder(ctx.builder);

		LLVMDisposeModule(ctx.module);

		LLVMContextDispose(ctx.context);

		return NULL;
	}

	LLVMDisposeMessage(error);

	LlvmModule *module = new (ctx.get<LlvmModule>()) LlvmModule();

	LLVMMemoryBufferRef buffer = LLVMWriteBitcodeToMemoryBuffer(ctx.module);

	module->moduleSize = (unsigned)LLVMGetBufferSize(buffer);

	module->moduleData = (char*)ctx.allocator->alloc(module->moduleSize);

	if(const char *start = LLVMGetBufferStart(buffer))
		memcpy(module->moduleData, start, module->moduleSize);

	LLVMDisposeMemoryBuffer(buffer);

	LLVMDisposePassManager(ctx.functionPassManager);

	LLVMDisposeBuilder(ctx.builder);

	LLVMDisposeModule(ctx.module);

	LLVMContextDispose(ctx.context);

	return module;
}